

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1;
  DeclaratorSyntax *pDVar1;
  DeepCloneVisitor visitor;
  EqualsValueClauseSyntax *local_30;
  Token local_28;
  
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::VariableDimensionSyntax>
                     ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x60) == (SyntaxNode *)0x0) {
    local_30 = (EqualsValueClauseSyntax *)0x0;
  }
  else {
    local_30 = (EqualsValueClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DeclaratorSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::syntax::EqualsValueClauseSyntax*>
                     ((BumpAllocator *)__child_stack,&local_28,args_1,&local_30);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DeclaratorSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DeclaratorSyntax>(
        node.name.deepClone(alloc),
        *deepClone(node.dimensions, alloc),
        node.initializer ? deepClone(*node.initializer, alloc) : nullptr
    );
}